

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManyToOneRingBuffer.h
# Opt level: O0

void __thiscall
aeron::concurrent::ringbuffer::ManyToOneRingBuffer::ManyToOneRingBuffer
          (ManyToOneRingBuffer *this,AtomicBuffer *buffer)

{
  index_t iVar1;
  AtomicBuffer *in_RSI;
  undefined8 *in_RDI;
  index_t in_stack_000000a4;
  
  *in_RDI = in_RSI;
  iVar1 = AtomicBuffer::capacity(in_RSI);
  *(index_t *)(in_RDI + 1) = iVar1 + -0x300;
  RingBufferDescriptor::checkCapacity(in_stack_000000a4);
  *(int *)((long)in_RDI + 0xc) = *(int *)(in_RDI + 1) / 8;
  *(int *)(in_RDI + 3) = *(int *)(in_RDI + 1) + 0x80;
  *(int *)((long)in_RDI + 0x14) = *(int *)(in_RDI + 1) + 0x100;
  *(int *)(in_RDI + 2) = *(int *)(in_RDI + 1) + 0x180;
  *(int *)((long)in_RDI + 0x1c) = *(int *)(in_RDI + 1) + 0x200;
  *(int *)(in_RDI + 4) = *(int *)(in_RDI + 1) + 0x280;
  return;
}

Assistant:

ManyToOneRingBuffer(concurrent::AtomicBuffer& buffer) :
        m_buffer(buffer)
    {
        m_capacity = buffer.capacity() - RingBufferDescriptor::TRAILER_LENGTH;

        RingBufferDescriptor::checkCapacity(m_capacity);

        m_maxMsgLength = m_capacity / 8;

        m_tailPositionIndex = m_capacity + RingBufferDescriptor::TAIL_POSITION_OFFSET;
        m_headCachePositionIndex = m_capacity + RingBufferDescriptor::HEAD_CACHE_POSITION_OFFSET;
        m_headPositionIndex = m_capacity + RingBufferDescriptor::HEAD_POSITION_OFFSET;
        m_correlationIdCounterIndex = m_capacity + RingBufferDescriptor::CORRELATION_COUNTER_OFFSET;
        m_consumerHeartbeatIndex = m_capacity + RingBufferDescriptor::CONSUMER_HEARTBEAT_OFFSET;
    }